

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O3

void __thiscall PointerType::PointerType(PointerType *this,PointerType *other)

{
  (this->super_Type).kind = TK_PointerType;
  (this->super_Type).isConst = false;
  (this->super_Type)._vptr_Type = (_func_int **)&PTR__PointerType_0017d8f8;
  (this->sizes)._M_dataplus._M_p = (pointer)&(this->sizes).field_2;
  (this->sizes)._M_string_length = 0;
  (this->sizes).field_2._M_local_buf[0] = '\0';
  (this->structName)._M_dataplus._M_p = (pointer)&(this->structName).field_2;
  (this->structName)._M_string_length = 0;
  (this->structName).field_2._M_local_buf[0] = '\0';
  this->type = other->type;
  this->isArrayPointer = other->isArrayPointer;
  this->levels = other->levels;
  std::__cxx11::string::_M_assign((string *)&this->sizes);
  return;
}

Assistant:

PointerType::PointerType(const PointerType &other): Type(TK_PointerType) {
    type = other.type;
    isArrayPointer = other.isArrayPointer;
    levels = other.levels;
    sizes = other.sizes;
}